

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
LocalSupportVertexCallback::internalProcessTriangleIndex
          (LocalSupportVertexCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 *puVar1;
  long in_RSI;
  long in_RDI;
  btScalar bVar2;
  btScalar dot;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    bVar2 = btVector3::dot((btVector3 *)(in_RDI + 0x1c),
                           (btVector3 *)(in_RSI + (long)local_1c * 0x10));
    if (*(float *)(in_RDI + 0x18) <= bVar2 && bVar2 != *(float *)(in_RDI + 0x18)) {
      *(btScalar *)(in_RDI + 0x18) = bVar2;
      puVar1 = (undefined8 *)(in_RSI + (long)local_1c * 0x10);
      *(undefined8 *)(in_RDI + 8) = *puVar1;
      *(undefined8 *)(in_RDI + 0x10) = puVar1[1];
    }
  }
  return;
}

Assistant:

virtual void internalProcessTriangleIndex(btVector3* triangle,int partId,int  triangleIndex)
	{
		(void)triangleIndex;
		(void)partId;

		for (int i=0;i<3;i++)
		{
			btScalar dot = m_supportVecLocal.dot(triangle[i]);
			if (dot > m_maxDot)
			{
				m_maxDot = dot;
				m_supportVertexLocal = triangle[i];
			}
		}
	}